

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

ParseArgumentStatus __thiscall
google::protobuf::compiler::CommandLineInterface::ParseArguments
          (CommandLineInterface *this,int argc,char **argv)

{
  long lVar1;
  bool bVar2;
  __type _Var3;
  int iVar4;
  ostream *poVar5;
  ulong uVar6;
  size_type sVar7;
  char *pcVar8;
  reference pvVar9;
  pointer ppVar10;
  pointer pOVar11;
  LogMessage *pLVar12;
  bool local_329;
  LogFinisher local_241;
  LogMessage local_240;
  bool local_201;
  undefined1 local_200 [7];
  bool missing_proto_definitions;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  undefined1 local_160 [8];
  string plugin_name;
  __normal_iterator<google::protobuf::compiler::CommandLineInterface::OutputDirective_*,_std::vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>_>
  local_138;
  __normal_iterator<const_google::protobuf::compiler::CommandLineInterface::OutputDirective_*,_std::vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>_>
  local_130;
  const_iterator j;
  iterator iStack_120;
  bool foundImplicitPlugin;
  _Self local_118;
  iterator local_110;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  iterator local_100;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  const_iterator i_2;
  undefined1 local_e8 [3];
  bool foundUnknownPluginOption;
  ParseArgumentStatus status;
  string value;
  string name;
  int i_1;
  int local_80;
  allocator local_69;
  string local_68;
  int local_44;
  undefined1 local_40 [4];
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  char **argv_local;
  int argc_local;
  CommandLineInterface *this_local;
  
  arguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  std::__cxx11::string::operator=((string *)this,*argv);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_40);
  for (local_44 = 1; local_44 < argc; local_44 = local_44 + 1) {
    if (**(char **)(&(arguments.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus +
                   (long)local_44 * 8) == '@') {
      lVar1 = *(long *)(&(arguments.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus +
                       (long)local_44 * 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_68,(char *)(lVar1 + 1),&local_69);
      bVar2 = ExpandArgumentFile(this,&local_68,
                                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_40);
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Failed to open argument file: ");
        poVar5 = std::operator<<(poVar5,(char *)(*(long *)(&(arguments.
                                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->_M_dataplus + (long)local_44 * 8) + 1));
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        this_local._4_4_ = PARSE_ARGUMENT_FAIL;
        local_80 = 1;
        goto LAB_004399a8;
      }
    }
    else {
      pcVar8 = *(char **)(&(arguments.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus +
                         (long)local_44 * 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&i_1,pcVar8,(allocator *)(name.field_2._M_local_buf + 0xf));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_40,(value_type *)&i_1);
      std::__cxx11::string::~string((string *)&i_1);
      std::allocator<char>::~allocator((allocator<char> *)(name.field_2._M_local_buf + 0xf));
    }
  }
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_40);
  if (bVar2) {
    PrintHelpText(this);
    this_local._4_4_ = PARSE_ARGUMENT_DONE_AND_EXIT;
    local_80 = 1;
    goto LAB_004399a8;
  }
  for (name.field_2._8_4_ = 0; uVar6 = (ulong)(int)name.field_2._8_4_,
      sVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_40), uVar6 < sVar7; name.field_2._8_4_ = name.field_2._8_4_ + 1) {
    std::__cxx11::string::string((string *)(value.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_40,(long)(int)name.field_2._8_4_);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    bVar2 = ParseArgument(this,pcVar8,(string *)(value.field_2._M_local_buf + 8),(string *)local_e8)
    ;
    if (bVar2) {
      iVar4 = name.field_2._8_4_ + 1;
      sVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_40);
      if ((long)iVar4 != sVar7) {
        pvVar9 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_40,(long)(name.field_2._8_4_ + 1));
        pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)pvVar9);
        if (*pcVar8 != '-') {
          name.field_2._8_4_ = name.field_2._8_4_ + 1;
          pvVar9 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_40,(long)(int)name.field_2._8_4_);
          std::__cxx11::string::operator=((string *)local_e8,(string *)pvVar9);
          goto LAB_0043901a;
        }
      }
      poVar5 = std::operator<<((ostream *)&std::cerr,"Missing value for flag: ");
      poVar5 = std::operator<<(poVar5,(string *)(value.field_2._M_local_buf + 8));
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&value.field_2 + 8),"--decode");
      if (bVar2) {
        poVar5 = std::operator<<((ostream *)&std::cerr,
                                 "To decode an unknown message, use --decode_raw.");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
      this_local._4_4_ = PARSE_ARGUMENT_FAIL;
      local_80 = 1;
    }
    else {
LAB_0043901a:
      i_2._M_node._4_4_ =
           InterpretArgument(this,(string *)((long)&value.field_2 + 8),(string *)local_e8);
      if (i_2._M_node._4_4_ == PARSE_ARGUMENT_DONE_AND_CONTINUE) {
        local_80 = 0;
      }
      else {
        local_80 = 1;
        this_local._4_4_ = i_2._M_node._4_4_;
      }
    }
    std::__cxx11::string::~string((string *)local_e8);
    std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
    if (local_80 != 0) goto LAB_004399a8;
  }
  i_2._M_node._3_1_ = 0;
  local_100._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin(&this->plugin_parameters_);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree_const_iterator(&local_f8,&local_100);
  while( true ) {
    local_110._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&this->plugin_parameters_);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree_const_iterator(&local_108,&local_110);
    bVar2 = std::operator!=(&local_f8,&local_108);
    if (!bVar2) break;
    ppVar10 = std::
              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator->(&local_f8);
    local_118._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(&this->plugins_,&ppVar10->first);
    iStack_120 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::end(&this->plugins_);
    bVar2 = std::operator!=(&local_118,&stack0xfffffffffffffee0);
    if (!bVar2) {
      j._M_current._7_1_ = 0;
      local_138._M_current =
           (OutputDirective *)
           std::
           vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
           ::begin(&this->output_directives_);
      __gnu_cxx::
      __normal_iterator<google::protobuf::compiler::CommandLineInterface::OutputDirective_const*,std::vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>>>
      ::__normal_iterator<google::protobuf::compiler::CommandLineInterface::OutputDirective*>
                ((__normal_iterator<google::protobuf::compiler::CommandLineInterface::OutputDirective_const*,std::vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>>>
                  *)&local_130,&local_138);
      while( true ) {
        plugin_name.field_2._8_8_ =
             std::
             vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
             ::end(&this->output_directives_);
        bVar2 = __gnu_cxx::operator!=
                          (&local_130,
                           (__normal_iterator<google::protobuf::compiler::CommandLineInterface::OutputDirective_*,_std::vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>_>
                            *)((long)&plugin_name.field_2 + 8));
        if (!bVar2) break;
        pOVar11 = __gnu_cxx::
                  __normal_iterator<const_google::protobuf::compiler::CommandLineInterface::OutputDirective_*,_std::vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>_>
                  ::operator->(&local_130);
        if (pOVar11->generator == (CodeGenerator *)0x0) {
          pOVar11 = __gnu_cxx::
                    __normal_iterator<const_google::protobuf::compiler::CommandLineInterface::OutputDirective_*,_std::vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>_>
                    ::operator->(&local_130);
          anon_unknown_4::PluginName((string *)local_160,&this->plugin_prefix_,&pOVar11->name);
          ppVar10 = std::
                    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator->(&local_f8);
          _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_160,&ppVar10->first);
          if (_Var3) {
            j._M_current._7_1_ = 1;
            local_80 = 0xb;
          }
          else {
            local_80 = 0;
          }
          std::__cxx11::string::~string((string *)local_160);
          if (local_80 != 0) break;
        }
        __gnu_cxx::
        __normal_iterator<const_google::protobuf::compiler::CommandLineInterface::OutputDirective_*,_std::vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>_>
        ::operator++(&local_130);
      }
      if ((j._M_current._7_1_ & 1) == 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Unknown flag: ");
        ppVar10 = std::
                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator->(&local_f8);
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)&local_1c0,(ulong)ppVar10);
        std::operator+(&local_1a0,"--",&local_1c0);
        std::operator+(&local_180,&local_1a0,"_opt");
        poVar5 = std::operator<<(poVar5,(string *)&local_180);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_1c0);
        i_2._M_node._3_1_ = 1;
      }
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&local_f8);
  }
  if ((i_2._M_node._3_1_ & 1) != 0) {
    this_local._4_4_ = PARSE_ARGUMENT_FAIL;
    local_80 = 1;
    goto LAB_004399a8;
  }
  bVar2 = std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(&this->proto_path_);
  if ((bVar2) &&
     (bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this->descriptor_set_in_names_), bVar2)) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[1],_const_char_(&)[2],_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_200,(char (*) [1])0x76a5a1,(char (*) [2])0x7c9082);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back(&this->proto_path_,(value_type *)local_200);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_200);
  }
  local_201 = false;
  switch(this->mode_) {
  case MODE_COMPILE:
    local_201 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(&this->input_files_);
    break;
  case MODE_ENCODE:
  case MODE_PRINT:
switchD_00439524_caseD_1:
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&this->input_files_);
    local_329 = false;
    if (bVar2) {
      local_329 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty(&this->descriptor_set_in_names_);
    }
    local_201 = local_329;
    break;
  case MODE_DECODE:
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) goto switchD_00439524_caseD_1;
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&this->input_files_);
    if ((!bVar2) ||
       (bVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(&this->descriptor_set_in_names_), !bVar2)) {
      poVar5 = std::operator<<((ostream *)&std::cerr,
                               "When using --decode_raw, no input files should be given.");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      this_local._4_4_ = PARSE_ARGUMENT_FAIL;
      local_80 = 1;
      goto LAB_004399a8;
    }
    local_201 = false;
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_240,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/command_line_interface.cc"
               ,0x613);
    pLVar12 = internal::LogMessage::operator<<(&local_240,"Unexpected mode: ");
    pLVar12 = internal::LogMessage::operator<<(pLVar12,this->mode_);
    internal::LogFinisher::operator=(&local_241,pLVar12);
    internal::LogMessage::~LogMessage(&local_240);
  }
  if ((local_201 & 1U) == 0) {
    if (((this->mode_ == MODE_COMPILE) &&
        (bVar2 = std::
                 vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                 ::empty(&this->output_directives_), bVar2)) &&
       (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) != 0)) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Missing output directives.");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      this_local._4_4_ = PARSE_ARGUMENT_FAIL;
      local_80 = 1;
    }
    else if ((this->mode_ == MODE_COMPILE) ||
            (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) != 0)) {
      if ((this->mode_ == MODE_ENCODE) || ((this->deterministic_output_ & 1U) == 0)) {
        uVar6 = std::__cxx11::string::empty();
        if (((uVar6 & 1) == 0) &&
           (sVar7 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(&this->input_files_), 1 < sVar7)) {
          poVar5 = std::operator<<((ostream *)&std::cerr,
                                   "Can only process one input file when using --dependency_out=FILE."
                                  );
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          this_local._4_4_ = PARSE_ARGUMENT_FAIL;
          local_80 = 1;
        }
        else {
          if (((this->imports_in_descriptor_set_ & 1U) != 0) &&
             (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) != 0)) {
            poVar5 = std::operator<<((ostream *)&std::cerr,
                                     "--include_imports only makes sense when combined with --descriptor_set_out."
                                    );
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          }
          if (((this->source_info_in_descriptor_set_ & 1U) != 0) &&
             (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) != 0)) {
            poVar5 = std::operator<<((ostream *)&std::cerr,
                                     "--include_source_info only makes sense when combined with --descriptor_set_out."
                                    );
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          }
          this_local._4_4_ = PARSE_ARGUMENT_DONE_AND_CONTINUE;
          local_80 = 1;
        }
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cerr,
                                 "Can only use --deterministic_output with --encode.");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        this_local._4_4_ = PARSE_ARGUMENT_FAIL;
        local_80 = 1;
      }
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cerr,
                               "Can only use --dependency_out=FILE when generating code.");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      this_local._4_4_ = PARSE_ARGUMENT_FAIL;
      local_80 = 1;
    }
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Missing input file.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    this_local._4_4_ = PARSE_ARGUMENT_FAIL;
    local_80 = 1;
  }
LAB_004399a8:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_40);
  return this_local._4_4_;
}

Assistant:

CommandLineInterface::ParseArgumentStatus CommandLineInterface::ParseArguments(
    int argc, const char* const argv[]) {
  executable_name_ = argv[0];

  std::vector<std::string> arguments;
  for (int i = 1; i < argc; ++i) {
    if (argv[i][0] == '@') {
      if (!ExpandArgumentFile(argv[i] + 1, &arguments)) {
        std::cerr << "Failed to open argument file: " << (argv[i] + 1)
                  << std::endl;
        return PARSE_ARGUMENT_FAIL;
      }
      continue;
    }
    arguments.push_back(argv[i]);
  }

  // if no arguments are given, show help
  if (arguments.empty()) {
    PrintHelpText();
    return PARSE_ARGUMENT_DONE_AND_EXIT;  // Exit without running compiler.
  }

  // Iterate through all arguments and parse them.
  for (int i = 0; i < arguments.size(); ++i) {
    std::string name, value;

    if (ParseArgument(arguments[i].c_str(), &name, &value)) {
      // Returned true => Use the next argument as the flag value.
      if (i + 1 == arguments.size() || arguments[i + 1][0] == '-') {
        std::cerr << "Missing value for flag: " << name << std::endl;
        if (name == "--decode") {
          std::cerr << "To decode an unknown message, use --decode_raw."
                    << std::endl;
        }
        return PARSE_ARGUMENT_FAIL;
      } else {
        ++i;
        value = arguments[i];
      }
    }

    ParseArgumentStatus status = InterpretArgument(name, value);
    if (status != PARSE_ARGUMENT_DONE_AND_CONTINUE) return status;
  }

  // Make sure each plugin option has a matching plugin output.
  bool foundUnknownPluginOption = false;
  for (std::map<std::string, std::string>::const_iterator i =
           plugin_parameters_.begin();
       i != plugin_parameters_.end(); ++i) {
    if (plugins_.find(i->first) != plugins_.end()) {
      continue;
    }
    bool foundImplicitPlugin = false;
    for (std::vector<OutputDirective>::const_iterator j =
             output_directives_.begin();
         j != output_directives_.end(); ++j) {
      if (j->generator == NULL) {
        std::string plugin_name = PluginName(plugin_prefix_, j->name);
        if (plugin_name == i->first) {
          foundImplicitPlugin = true;
          break;
        }
      }
    }
    if (!foundImplicitPlugin) {
      std::cerr << "Unknown flag: "
                // strip prefix + "gen-" and add back "_opt"
                << "--" + i->first.substr(plugin_prefix_.size() + 4) + "_opt"
                << std::endl;
      foundUnknownPluginOption = true;
    }
  }
  if (foundUnknownPluginOption) {
    return PARSE_ARGUMENT_FAIL;
  }

  // The --proto_path & --descriptor_set_in flags both specify places to look
  // for proto files. If neither were given, use the current working directory.
  if (proto_path_.empty() && descriptor_set_in_names_.empty()) {
    // Don't use make_pair as the old/default standard library on Solaris
    // doesn't support it without explicit template parameters, which are
    // incompatible with C++0x's make_pair.
    proto_path_.push_back(std::pair<std::string, std::string>("", "."));
  }

  // Check error cases that span multiple flag values.
  bool missing_proto_definitions = false;
  switch (mode_) {
    case MODE_COMPILE:
      missing_proto_definitions = input_files_.empty();
      break;
    case MODE_DECODE:
      // Handle --decode_raw separately, since it requires that no proto
      // definitions are specified.
      if (codec_type_.empty()) {
        if (!input_files_.empty() || !descriptor_set_in_names_.empty()) {
          std::cerr
              << "When using --decode_raw, no input files should be given."
              << std::endl;
          return PARSE_ARGUMENT_FAIL;
        }
        missing_proto_definitions = false;
        break;  // only for --decode_raw
      }
      // --decode (not raw) is handled the same way as the rest of the modes.
      PROTOBUF_FALLTHROUGH_INTENDED;
    case MODE_ENCODE:
    case MODE_PRINT:
      missing_proto_definitions =
          input_files_.empty() && descriptor_set_in_names_.empty();
      break;
    default:
      GOOGLE_LOG(FATAL) << "Unexpected mode: " << mode_;
  }
  if (missing_proto_definitions) {
    std::cerr << "Missing input file." << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (mode_ == MODE_COMPILE && output_directives_.empty() &&
      descriptor_set_out_name_.empty()) {
    std::cerr << "Missing output directives." << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (mode_ != MODE_COMPILE && !dependency_out_name_.empty()) {
    std::cerr << "Can only use --dependency_out=FILE when generating code."
              << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (mode_ != MODE_ENCODE && deterministic_output_) {
    std::cerr << "Can only use --deterministic_output with --encode."
              << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (!dependency_out_name_.empty() && input_files_.size() > 1) {
    std::cerr
        << "Can only process one input file when using --dependency_out=FILE."
        << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (imports_in_descriptor_set_ && descriptor_set_out_name_.empty()) {
    std::cerr << "--include_imports only makes sense when combined with "
                 "--descriptor_set_out."
              << std::endl;
  }
  if (source_info_in_descriptor_set_ && descriptor_set_out_name_.empty()) {
    std::cerr << "--include_source_info only makes sense when combined with "
                 "--descriptor_set_out."
              << std::endl;
  }

  return PARSE_ARGUMENT_DONE_AND_CONTINUE;
}